

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          basic_istream<char,_std::char_traits<char>_> *is,basic_json_decode_options<char> *options)

{
  system_error *this_00;
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar1;
  error_code __ec;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> reader;
  string local_380;
  error_code local_360;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_350;
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> local_2d0;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&local_350,(allocator_type *)&local_2d0,(temp_allocator_type *)&local_380);
  basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
  basic_json_reader<std::istream&>
            ((basic_json_reader<char,jsoncons::stream_source<char>,std::allocator<char>> *)
             &local_2d0,is,&local_350.super_basic_json_visitor<char>,options,
             (allocator<char> *)&local_380);
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::read_next
            (&local_2d0);
  basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::check_done
            (&local_2d0);
  if (local_350.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    basic_json_parser<char,_std::allocator<char>_>::~basic_json_parser(&local_2d0.parser_);
    stream_source<char>::~stream_source((stream_source<char> *)&local_2d0);
    if (local_350.structure_stack_.
        super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_350.structure_stack_.
                      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_350.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_350.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector(&local_350.item_stack_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350.name_._M_dataplus._M_p != &local_350.name_.field_2) {
      operator_delete(local_350.name_._M_dataplus._M_p,
                      local_350.name_.field_2._M_allocated_capacity + 1);
    }
    destroy(&local_350.result_);
    bVar1.field_0.int64_.val_ = extraout_RDX;
    bVar1.field_0._0_8_ = this;
    return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar1.field_0;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::json_errc,void>(&local_360,source_error);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_380,"Failed to parse json stream","");
  __ec._4_4_ = 0;
  __ec._M_value = local_360._M_value;
  *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b58738;
  __ec._M_cat = local_360._M_cat;
  std::system_error::system_error(this_00,__ec,&local_380);
  *(undefined8 *)this_00 = 0xb586d8;
  *(undefined8 *)(this_00 + 0x50) = 0xb58710;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(undefined8 *)(this_00 + 0x28) = 0;
  *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
  *(undefined8 *)(this_00 + 0x38) = 0;
  this_00[0x40] = (system_error)0x0;
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

static basic_json parse(std::basic_istream<char_type>& is, 
            const basic_json_decode_options<char_type>& options = basic_json_options<CharT>())
        {
            json_decoder<basic_json> decoder;
            basic_json_reader<char_type,stream_source<char_type>,Allocator> reader(is, decoder, options);
            reader.read_next();
            reader.check_done();
            if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(json_errc::source_error, "Failed to parse json stream"));
            }
            return decoder.get_result();
        }